

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O1

int re_readpattern(char *re_prompt)

{
  int __errcode;
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  char local_168 [8];
  char message [256];
  char tpat [80];
  
  if (re_pat[0] == '\0') {
    pcVar1 = eread("%s: ",message + 0xf8,0x50,0x18,re_prompt);
  }
  else {
    pcVar1 = eread("%s (default %s): ",message + 0xf8,0x50,0x58,re_prompt,re_pat);
  }
  if (pcVar1 == (char *)0x0) {
    uVar2 = 2;
  }
  else if (*pcVar1 == '\0') {
    uVar2 = (uint)(re_pat[0] != '\0');
  }
  else {
    strlcpy(re_pat,message + 0xf8,0x50);
    bVar3 = casefoldsearch != 0;
    if (re_readpattern_dofree == '\x01') {
      regfree((regex_t *)&regex_buff);
    }
    __errcode = regcomp((regex_t *)&regex_buff,re_pat,(uint)bVar3 * 2 + 1);
    if (__errcode == 0) {
      re_readpattern_dofree = '\x01';
      uVar2 = 1;
    }
    else {
      regerror(__errcode,(regex_t *)&regex_buff,local_168,0x100);
      dobeep();
      uVar2 = 0;
      ewprintf("Regex Error: %s",local_168);
      re_pat[0] = '\0';
    }
  }
  return uVar2;
}

Assistant:

static int
re_readpattern(char *re_prompt)
{
	static int	dofree = 0;
	int		flags, error, s;
	char		tpat[NPAT], *rep;

	if (re_pat[0] == '\0')
		rep = eread("%s: ", tpat, NPAT, EFNEW | EFCR, re_prompt);
	else
		rep = eread("%s (default %s): ", tpat, NPAT,
		    EFNUL | EFNEW | EFCR, re_prompt, re_pat);
	if (rep == NULL)
		return (ABORT);
	if (rep[0] != '\0') {
		/* New pattern given */
		(void)strlcpy(re_pat, tpat, sizeof(re_pat));
		if (casefoldsearch)
			flags = REG_EXTENDED | REG_ICASE;
		else
			flags = REG_EXTENDED;
		if (dofree)
			regfree(&regex_buff);
		error = regcomp(&regex_buff, re_pat, flags);
		if (error != 0) {
			char	message[256];
			regerror(error, &regex_buff, message, sizeof(message));
			dobeep();
			ewprintf("Regex Error: %s", message);
			re_pat[0] = '\0';
			return (FALSE);
		}
		dofree = 1;
		s = TRUE;
	} else if (rep[0] == '\0' && re_pat[0] != '\0')
		/* Just using old pattern */
		s = TRUE;
	else
		s = FALSE;
	return (s);
}